

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O1

void luaS_resize(lua_State *L,int newsize)

{
  global_State *pgVar1;
  TString *pTVar2;
  TString **ppTVar3;
  long lVar4;
  TString *pTVar5;
  int iVar6;
  uint uVar7;
  
  pgVar1 = L->l_G;
  iVar6 = (pgVar1->strt).size;
  if (iVar6 < newsize) {
    ppTVar3 = (TString **)luaM_realloc_(L,(pgVar1->strt).hash,(long)iVar6 << 3,(long)newsize * 8);
    (pgVar1->strt).hash = ppTVar3;
    iVar6 = (pgVar1->strt).size;
    lVar4 = (long)iVar6;
    if (iVar6 < newsize) {
      do {
        (pgVar1->strt).hash[lVar4] = (TString *)0x0;
        lVar4 = lVar4 + 1;
      } while (newsize != lVar4);
    }
  }
  iVar6 = (pgVar1->strt).size;
  if (0 < iVar6) {
    lVar4 = 0;
    do {
      ppTVar3 = (pgVar1->strt).hash;
      pTVar5 = ppTVar3[lVar4];
      ppTVar3[lVar4] = (TString *)0x0;
      if (pTVar5 != (TString *)0x0) {
        if (1 < (uint)POPCOUNT(newsize)) {
          __assert_fail("(newsize&(newsize-1))==0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstring.c"
                        ,0x54,"void luaS_resize(lua_State *, int)");
        }
        do {
          pTVar2 = (pTVar5->u).hnext;
          uVar7 = pTVar5->hash & newsize - 1U;
          pTVar5->u = *(anon_union_8_2_b887aad4_for_u *)((pgVar1->strt).hash + uVar7);
          (pgVar1->strt).hash[uVar7] = pTVar5;
          pTVar5 = pTVar2;
        } while (pTVar2 != (TString *)0x0);
      }
      lVar4 = lVar4 + 1;
      iVar6 = (pgVar1->strt).size;
    } while (lVar4 < iVar6);
  }
  if (newsize < iVar6) {
    ppTVar3 = (pgVar1->strt).hash;
    if ((ppTVar3[newsize] != (TString *)0x0) || (ppTVar3[(long)iVar6 + -1] != (TString *)0x0)) {
      __assert_fail("tb->hash[newsize] == ((void*)0) && tb->hash[tb->size - 1] == ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstring.c"
                    ,0x5c,"void luaS_resize(lua_State *, int)");
    }
    ppTVar3 = (TString **)luaM_realloc_(L,ppTVar3,(long)iVar6 << 3,(long)newsize << 3);
    (pgVar1->strt).hash = ppTVar3;
  }
  (pgVar1->strt).size = newsize;
  return;
}

Assistant:

void luaS_resize (lua_State *L, int newsize) {
  int i;
  stringtable *tb = &G(L)->strt;
  if (newsize > tb->size) {  /* grow table if needed */
    luaM_reallocvector(L, tb->hash, tb->size, newsize, TString *);
    for (i = tb->size; i < newsize; i++)
      tb->hash[i] = NULL;
  }
  for (i = 0; i < tb->size; i++) {  /* rehash */
    TString *p = tb->hash[i];
    tb->hash[i] = NULL;
    while (p) {  /* for each node in the list */
      TString *hnext = p->u.hnext;  /* save next */
      unsigned int h = lmod(p->hash, newsize);  /* new position */
      p->u.hnext = tb->hash[h];  /* chain it */
      tb->hash[h] = p;
      p = hnext;
    }
  }
  if (newsize < tb->size) {  /* shrink table if needed */
    /* vanishing slice should be empty */
    lua_assert(tb->hash[newsize] == NULL && tb->hash[tb->size - 1] == NULL);
    luaM_reallocvector(L, tb->hash, tb->size, newsize, TString *);
  }
  tb->size = newsize;
}